

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O1

QString * __thiscall
Mustache::PartialFileLoader::getPartial
          (QString *__return_storage_ptr__,PartialFileLoader *this,QString *name)

{
  Data<QHashPrivate::Node<QString,_QString>_> *this_00;
  char cVar1;
  Node<QString,_QString> *pNVar2;
  QByteArrayView QVar3;
  QString t;
  QFile file;
  QString path;
  QArrayData *local_88;
  char16_t *local_80;
  qsizetype qStack_78;
  QArrayData *local_70;
  char16_t *local_68;
  qsizetype qStack_60;
  QString local_58;
  QArrayData *local_38;
  char16_t *local_30;
  qsizetype qStack_28;
  
  this_00 = (this->m_cache).d;
  if (this_00 != (Data<QHashPrivate::Node<QString,_QString>_> *)0x0) {
    pNVar2 = QHashPrivate::Data<QHashPrivate::Node<QString,_QString>_>::findNode(this_00,name);
    if (pNVar2 != (Node<QString,_QString> *)0x0) goto LAB_0011684a;
  }
  local_88 = &((this->m_basePath).d.d)->super_QArrayData;
  local_80 = (this->m_basePath).d.ptr;
  qStack_78 = (this->m_basePath).d.size;
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_88->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_88->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::append((QChar)(char16_t)&local_88);
  local_70 = local_88;
  local_68 = local_80;
  qStack_60 = qStack_78;
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_88->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_88->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::append((QString *)&local_70);
  local_38 = local_70;
  local_30 = local_68;
  qStack_28 = qStack_60;
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_70->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_70->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar3.m_data = (storage_type *)0x9;
  QVar3.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar3);
  QString::append((QString *)&local_38);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,2,8);
    }
  }
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,8);
    }
  }
  QFile::QFile((QFile *)&local_70,(QString *)&local_38);
  cVar1 = QFile::open(&local_70,1);
  if (cVar1 != '\0') {
    QTextStream::QTextStream((QTextStream *)&local_88,(QIODevice *)&local_70);
    QTextStream::readAll();
    QHash<QString,QString>::emplace<QString_const&>
              ((QHash<QString,QString> *)&this->m_cache,name,&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
      }
    }
    QTextStream::~QTextStream((QTextStream *)&local_88);
  }
  QFile::~QFile((QFile *)&local_70);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
LAB_0011684a:
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  QHash<QString,_QString>::value(__return_storage_ptr__,&this->m_cache,name,&local_58);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString PartialFileLoader::getPartial(const QString& name)
{
	if (!m_cache.contains(name)) {
		QString path = m_basePath + '/' + name + ".mustache";
		QFile file(path);
		if (file.open(QIODevice::ReadOnly)) {
			QTextStream stream(&file);
			m_cache.insert(name, stream.readAll());
		}
	}
	return m_cache.value(name);
}